

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgramCache.cpp
# Opt level: O2

bool __thiscall
Diligent::GLProgramCache::ProgramCacheKey::operator==(ProgramCacheKey *this,ProgramCacheKey *Key)

{
  bool bVar1;
  
  if ((((this->Hash == Key->Hash) && (this->IsSeparableProgram == Key->IsSeparableProgram)) &&
      (bVar1 = std::operator==(&this->ShaderUIDs,&Key->ShaderUIDs), bVar1)) &&
     (bVar1 = std::operator==(&this->SignaturUIDs,&Key->SignaturUIDs), bVar1)) {
    if ((this->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->SignaturUIDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return true;
    }
    bVar1 = PipelineResourceLayoutDesc::operator==
                      (&(this->ResourceLayout).super_PipelineResourceLayoutDesc,
                       &(Key->ResourceLayout).super_PipelineResourceLayoutDesc);
    return bVar1;
  }
  return false;
}

Assistant:

bool GLProgramCache::ProgramCacheKey::operator==(const ProgramCacheKey& Key) const noexcept
{
    // clang-format off
    return (Hash               == Key.Hash               &&
            IsSeparableProgram == Key.IsSeparableProgram &&
            ShaderUIDs         == Key.ShaderUIDs         &&
            SignaturUIDs       == Key.SignaturUIDs       &&
            (!SignaturUIDs.empty() || ResourceLayout == Key.ResourceLayout));
    // clang-format on
}